

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uprops.cpp
# Opt level: O0

void uprops_addPropertyStarts_63(UPropertySource src,USetAdder *sa,UErrorCode *pErrorCode)

{
  UBool UVar1;
  UChar32 UVar2;
  UChar32 local_2c;
  UChar32 end;
  UChar32 start;
  UCPTrie *trie;
  UErrorCode *pErrorCode_local;
  USetAdder *sa_local;
  UPropertySource src_local;
  
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 == '\0') {
    if (src == UPROPS_SRC_INPC) {
      _end = &inpc_trie;
    }
    else if (src == UPROPS_SRC_INSC) {
      _end = &insc_trie;
    }
    else {
      if (src != UPROPS_SRC_VO) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return;
      }
      _end = &vo_trie;
    }
    local_2c = 0;
    while (UVar2 = ucptrie_getRange_63(_end,local_2c,UCPMAP_RANGE_NORMAL,0,(UCPMapValueFilter *)0x0,
                                       (void *)0x0,(uint32_t *)0x0), -1 < UVar2) {
      (*(code *)sa->add)(sa->set,local_2c);
      local_2c = UVar2 + 1;
    }
  }
  return;
}

Assistant:

U_CFUNC void U_EXPORT2
uprops_addPropertyStarts(UPropertySource src, const USetAdder *sa, UErrorCode *pErrorCode) {
    if (U_FAILURE(*pErrorCode)) { return; }
    const UCPTrie *trie;
    switch (src) {
    case UPROPS_SRC_INPC:
        trie = &inpc_trie;
        break;
    case UPROPS_SRC_INSC:
        trie = &insc_trie;
        break;
    case UPROPS_SRC_VO:
        trie = &vo_trie;
        break;
    default:
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    // Add the start code point of each same-value range of the trie.
    UChar32 start = 0, end;
    while ((end = ucptrie_getRange(trie, start, UCPMAP_RANGE_NORMAL, 0,
                                   nullptr, nullptr, nullptr)) >= 0) {
        sa->add(sa->set, start);
        start = end + 1;
    }
}